

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::shaderexecutor::anon_unknown_0::CommonFunctionTestInstance::iterate
          (TestStatus *__return_storage_ptr__,CommonFunctionTestInstance *this)

{
  allocator<unsigned_int> *this_00;
  allocator<void_*> *this_01;
  value_type pvVar1;
  int iVar2;
  uint uVar3;
  const_reference ppvVar4;
  ShaderExecutor *pSVar5;
  const_reference ppvVar6;
  size_type sVar7;
  const_reference pvVar8;
  reference ppvVar9;
  reference ppvVar10;
  TestLog *pTVar11;
  MessageBuilder *pMVar12;
  const_reference pvVar13;
  allocator<char> local_af9;
  string local_af8;
  undefined4 local_ad8;
  allocator<char> local_ad1;
  string local_ad0;
  int local_aac;
  MessageBuilder local_aa8;
  allocator<char> local_921;
  string local_920 [32];
  VarValue local_900;
  MessageBuilder local_8f0;
  int local_76c;
  undefined1 local_768 [4];
  int outNdx_1;
  VarValue local_5e8;
  MessageBuilder local_5d8;
  int local_454;
  undefined1 local_450 [4];
  int inNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  MessageBuilder local_2b0;
  int local_12c;
  int local_128;
  int outNdx;
  int inNdx;
  int valNdx;
  TestContext *testCtx;
  int numFailed;
  vector<void_*,_std::allocator<void_*>_> curOutputPtr;
  undefined1 local_f0 [8];
  vector<void_*,_std::allocator<void_*>_> curInputPtr;
  vector<int,_std::allocator<int>_> outScalarSizes;
  vector<int,_std::allocator<int>_> inScalarSizes;
  undefined1 local_a0 [8];
  vector<void_*,_std::allocator<void_*>_> outputPointers;
  vector<void_*,_std::allocator<void_*>_> inputPointers;
  undefined1 local_68 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputData;
  allocator<unsigned_int> local_39;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputData;
  int numOutputScalars;
  int numInputScalars;
  CommonFunctionTestInstance *this_local;
  
  inputData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = computeTotalScalarSize(&(this->m_spec).inputs);
  inputData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = computeTotalScalarSize(&(this->m_spec).outputs);
  iVar2 = inputData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ * this->m_numValues;
  std::allocator<unsigned_int>::allocator(&local_39);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,(long)iVar2,&local_39);
  std::allocator<unsigned_int>::~allocator(&local_39);
  iVar2 = (int)inputData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage * this->m_numValues;
  this_00 = (allocator<unsigned_int> *)
            ((long)&inputPointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,(long)iVar2,this_00);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&inputPointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  getInputOutputPointers
            ((vector<void_*,_std::allocator<void_*>_> *)
             &outputPointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&(this->m_spec).inputs,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,this->m_numValues);
  getInputOutputPointers
            ((vector<void_*,_std::allocator<void_*>_> *)local_a0,&(this->m_spec).outputs,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,this->m_numValues);
  uVar3 = this->m_numValues;
  ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                      ((vector<void_*,_std::allocator<void_*>_> *)
                       &outputPointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(this,(ulong)uVar3,ppvVar4);
  pSVar5 = de::details::
           UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           ::operator->(&(this->m_executor).
                         super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                       );
  uVar3 = this->m_numValues;
  ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                      ((vector<void_*,_std::allocator<void_*>_> *)
                       &outputPointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0);
  ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                      ((vector<void_*,_std::allocator<void_*>_> *)local_a0,0);
  ::vk::Handle<(vk::HandleType)22>::Handle
            ((Handle<(vk::HandleType)22> *)
             &inScalarSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  (*pSVar5->_vptr_ShaderExecutor[2])
            (pSVar5,(ulong)uVar3,ppvVar4,ppvVar6,
             inScalarSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  getScalarSizes((vector<int,_std::allocator<int>_> *)
                 &outScalarSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&(this->m_spec).inputs);
  getScalarSizes((vector<int,_std::allocator<int>_> *)
                 &curInputPtr.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&(this->m_spec).outputs);
  sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size
                    ((vector<void_*,_std::allocator<void_*>_> *)
                     &outputPointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  this_01 = (allocator<void_*> *)
            ((long)&curOutputPtr.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<void_*>::allocator(this_01);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_f0,sVar7,this_01);
  std::allocator<void_*>::~allocator
            ((allocator<void_*> *)
             ((long)&curOutputPtr.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size
                    ((vector<void_*,_std::allocator<void_*>_> *)local_a0);
  std::allocator<void_*>::allocator((allocator<void_*> *)((long)&testCtx + 7));
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)&numFailed,sVar7,
             (allocator<void_*> *)((long)&testCtx + 7));
  std::allocator<void_*>::~allocator((allocator<void_*> *)((long)&testCtx + 7));
  testCtx._0_4_ = 0;
  _inNdx = Context::getTestContext((this->super_TestInstance).m_context);
  for (outNdx = 0; outNdx < this->m_numValues; outNdx = outNdx + 1) {
    local_128 = 0;
    while( true ) {
      iVar2 = local_128;
      sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size
                        ((vector<void_*,_std::allocator<void_*>_> *)local_f0);
      if ((int)sVar7 <= iVar2) break;
      ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)
                           &outputPointers.super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_128);
      pvVar1 = *ppvVar4;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &outScalarSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_128);
      iVar2 = *pvVar8 * outNdx;
      ppvVar9 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)local_f0,(long)local_128);
      *ppvVar9 = (value_type)((long)pvVar1 + (long)iVar2 * 4);
      local_128 = local_128 + 1;
    }
    local_12c = 0;
    while( true ) {
      iVar2 = local_12c;
      sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size
                        ((vector<void_*,_std::allocator<void_*>_> *)&numFailed);
      if ((int)sVar7 <= iVar2) break;
      ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)local_a0,(long)local_12c);
      pvVar1 = *ppvVar4;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &curInputPtr.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_12c);
      iVar2 = *pvVar8 * outNdx;
      ppvVar9 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)&numFailed,(long)local_12c);
      *ppvVar9 = (value_type)((long)pvVar1 + (long)iVar2 * 4);
      local_12c = local_12c + 1;
    }
    ppvVar9 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_f0,0);
    ppvVar10 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                         ((vector<void_*,_std::allocator<void_*>_> *)&numFailed,0);
    uVar3 = (*(this->super_TestInstance)._vptr_TestInstance[4])(this,ppvVar9,ppvVar10);
    if ((uVar3 & 1) == 0) {
      pTVar11 = tcu::TestContext::getLog(_inNdx);
      tcu::TestLog::operator<<(&local_2b0,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          (&local_2b0,(char (*) [36])"ERROR: comparison failed for value ");
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&outNdx);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [5])":\n  ");
      std::__cxx11::ostringstream::str();
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_2d0);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_2d0);
      tcu::MessageBuilder::~MessageBuilder(&local_2b0);
      pTVar11 = tcu::TestContext::getLog(_inNdx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_450,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_450,(char (*) [10])"  inputs:");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_450);
      local_454 = 0;
      while( true ) {
        iVar2 = local_454;
        sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size
                          ((vector<void_*,_std::allocator<void_*>_> *)local_f0);
        if ((int)sVar7 <= iVar2) break;
        pTVar11 = tcu::TestContext::getLog(_inNdx);
        tcu::TestLog::operator<<(&local_5d8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar12 = tcu::MessageBuilder::operator<<(&local_5d8,(char (*) [5])0x133bc65);
        pvVar13 = std::
                  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ::operator[](&(this->m_spec).inputs,(long)local_454);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pvVar13->name);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [4])0x1331044);
        pvVar13 = std::
                  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ::operator[](&(this->m_spec).inputs,(long)local_454);
        ppvVar9 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                            ((vector<void_*,_std::allocator<void_*>_> *)local_f0,(long)local_454);
        VarValue::VarValue(&local_5e8,&pvVar13->varType,*ppvVar9);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_5e8);
        tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5d8);
        local_454 = local_454 + 1;
      }
      pTVar11 = tcu::TestContext::getLog(_inNdx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_768,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_768,(char (*) [11])"  outputs:");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_768);
      local_76c = 0;
      while( true ) {
        iVar2 = local_76c;
        sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size
                          ((vector<void_*,_std::allocator<void_*>_> *)&numFailed);
        if ((int)sVar7 <= iVar2) break;
        pTVar11 = tcu::TestContext::getLog(_inNdx);
        tcu::TestLog::operator<<(&local_8f0,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar12 = tcu::MessageBuilder::operator<<(&local_8f0,(char (*) [5])0x133bc65);
        pvVar13 = std::
                  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ::operator[](&(this->m_spec).outputs,(long)local_76c);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pvVar13->name);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [4])0x1331044);
        pvVar13 = std::
                  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ::operator[](&(this->m_spec).outputs,(long)local_76c);
        ppvVar9 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                            ((vector<void_*,_std::allocator<void_*>_> *)&numFailed,(long)local_76c);
        VarValue::VarValue(&local_900,&pvVar13->varType,*ppvVar9);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_900);
        tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_8f0);
        local_76c = local_76c + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_920,"",&local_921);
      std::__cxx11::ostringstream::str((string *)&this->m_failMsg);
      std::__cxx11::string::~string(local_920);
      std::allocator<char>::~allocator(&local_921);
      std::ios::clear(&this->m_failMsg + *(long *)(*(long *)&this->m_failMsg + -0x18),0);
      testCtx._0_4_ = (int)testCtx + 1;
    }
  }
  pTVar11 = tcu::TestContext::getLog(_inNdx);
  tcu::TestLog::operator<<(&local_aa8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
  local_aac = this->m_numValues - (int)testCtx;
  pMVar12 = tcu::MessageBuilder::operator<<(&local_aa8,&local_aac);
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [4])" / ");
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&this->m_numValues);
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [15])" values passed");
  tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_aa8);
  if ((int)testCtx == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ad0,"Pass",&local_ad1);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_ad0);
    std::__cxx11::string::~string((string *)&local_ad0);
    std::allocator<char>::~allocator(&local_ad1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_af8,"Result comparison failed",&local_af9);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_af8);
    std::__cxx11::string::~string((string *)&local_af8);
    std::allocator<char>::~allocator(&local_af9);
  }
  local_ad8 = 1;
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)&numFailed);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_f0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &curInputPtr.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &outScalarSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_a0);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &outputPointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus CommonFunctionTestInstance::iterate (void)
{
	const int				numInputScalars			= computeTotalScalarSize(m_spec.inputs);
	const int				numOutputScalars		= computeTotalScalarSize(m_spec.outputs);
	vector<deUint32>		inputData				(numInputScalars * m_numValues);
	vector<deUint32>		outputData				(numOutputScalars * m_numValues);
	const vector<void*>		inputPointers			= getInputOutputPointers(m_spec.inputs, inputData, m_numValues);
	const vector<void*>		outputPointers			= getInputOutputPointers(m_spec.outputs, outputData, m_numValues);

	// Initialize input data.
	getInputValues(m_numValues, &inputPointers[0]);

	// Execute shader.
	m_executor->execute(m_numValues, &inputPointers[0], &outputPointers[0]);

	// Compare results.
	{
		const vector<int>		inScalarSizes		= getScalarSizes(m_spec.inputs);
		const vector<int>		outScalarSizes		= getScalarSizes(m_spec.outputs);
		vector<void*>			curInputPtr			(inputPointers.size());
		vector<void*>			curOutputPtr		(outputPointers.size());
		int						numFailed			= 0;
		tcu::TestContext&		testCtx				= m_context.getTestContext();

		for (int valNdx = 0; valNdx < m_numValues; valNdx++)
		{
			// Set up pointers for comparison.
			for (int inNdx = 0; inNdx < (int)curInputPtr.size(); ++inNdx)
				curInputPtr[inNdx] = (deUint32*)inputPointers[inNdx] + inScalarSizes[inNdx]*valNdx;

			for (int outNdx = 0; outNdx < (int)curOutputPtr.size(); ++outNdx)
				curOutputPtr[outNdx] = (deUint32*)outputPointers[outNdx] + outScalarSizes[outNdx]*valNdx;

			if (!compare(&curInputPtr[0], &curOutputPtr[0]))
			{
				// \todo [2013-08-08 pyry] We probably want to log reference value as well?

				testCtx.getLog() << TestLog::Message << "ERROR: comparison failed for value " << valNdx << ":\n  " << m_failMsg.str() << TestLog::EndMessage;

				testCtx.getLog() << TestLog::Message << "  inputs:" << TestLog::EndMessage;
				for (int inNdx = 0; inNdx < (int)curInputPtr.size(); inNdx++)
					testCtx.getLog() << TestLog::Message << "    " << m_spec.inputs[inNdx].name << " = "
														   << VarValue(m_spec.inputs[inNdx].varType, curInputPtr[inNdx])
									   << TestLog::EndMessage;

				testCtx.getLog() << TestLog::Message << "  outputs:" << TestLog::EndMessage;
				for (int outNdx = 0; outNdx < (int)curOutputPtr.size(); outNdx++)
					testCtx.getLog() << TestLog::Message << "    " << m_spec.outputs[outNdx].name << " = "
														   << VarValue(m_spec.outputs[outNdx].varType, curOutputPtr[outNdx])
									   << TestLog::EndMessage;

				m_failMsg.str("");
				m_failMsg.clear();
				numFailed += 1;
			}
		}

		testCtx.getLog() << TestLog::Message << (m_numValues - numFailed) << " / " << m_numValues << " values passed" << TestLog::EndMessage;

		if (numFailed == 0)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Result comparison failed");
	}
}